

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

string * __thiscall
testing::internal::MatchMatrix::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MatchMatrix *this)

{
  bool bVar1;
  size_t sVar2;
  ulong local_1b8;
  size_t j;
  size_t i;
  char *sep;
  stringstream ss;
  ostream aoStack_190 [376];
  MatchMatrix *local_18;
  MatchMatrix *this_local;
  
  local_18 = this;
  this_local = (MatchMatrix *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&sep);
  i = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  j = 0;
  while( true ) {
    sVar2 = LhsSize(this);
    if (sVar2 <= j) break;
    std::operator<<(aoStack_190,(char *)i);
    local_1b8 = 0;
    while( true ) {
      sVar2 = RhsSize(this);
      if (sVar2 <= local_1b8) break;
      bVar1 = HasEdge(this,j,local_1b8);
      std::ostream::operator<<(aoStack_190,bVar1);
      local_1b8 = local_1b8 + 1;
    }
    i = (long)"&amp;" + 4;
    j = j + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&sep);
  return __return_storage_ptr__;
}

Assistant:

std::string MatchMatrix::DebugString() const {
  ::std::stringstream ss;
  const char* sep = "";
  for (size_t i = 0; i < LhsSize(); ++i) {
    ss << sep;
    for (size_t j = 0; j < RhsSize(); ++j) {
      ss << HasEdge(i, j);
    }
    sep = ";";
  }
  return ss.str();
}